

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O0

void __thiscall Centaurus::ATNMachine<char>::parse_atom(ATNMachine<char> *this,Stream *stream)

{
  int iVar1;
  wchar_t wVar2;
  ATNNodeType AVar3;
  size_type sVar4;
  StreamException *__return_storage_ptr__;
  size_type sVar5;
  reference pvVar6;
  ATNNodeType local_d4;
  undefined1 local_d0 [8];
  ATNNode<char> node;
  int anchor_state;
  wchar_t ch;
  int origin_state;
  Stream *stream_local;
  ATNMachine<char> *this_local;
  
  sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                    (&this->m_nodes);
  iVar1 = (int)sVar4 + -1;
  wVar2 = Stream::skip_whitespace(stream);
  sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                    (&this->m_nodes);
  if (wVar2 == L'(') {
    Stream::discard(stream);
    parse_selection(this,stream);
    wVar2 = Stream::skip_whitespace(stream);
    if (wVar2 != L')') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar2);
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
    Stream::discard(stream);
  }
  else {
    ATNNode<char>::ATNNode((ATNNode<char> *)local_d0,stream);
    if ((0 < this->m_globalid) &&
       ((AVar3 = ATNNode<char>::type((ATNNode<char> *)local_d0), AVar3 == LiteralTerminal ||
        (AVar3 = ATNNode<char>::type((ATNNode<char> *)local_d0), AVar3 == RegularTerminal)))) {
      pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
               back(&this->m_nodes);
      sVar5 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
              size(&this->m_nodes);
      ATNNode<char>::add_transition(pvVar6,(int)sVar5,0);
      local_d4 = WhiteSpace;
      std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
      emplace_back<Centaurus::ATNNodeType>(&this->m_nodes,&local_d4);
    }
    pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::back
                       (&this->m_nodes);
    sVar5 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    ATNNode<char>::add_transition(pvVar6,(int)sVar5,0);
    std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::push_back
              (&this->m_nodes,(value_type *)local_d0);
    ATNNode<char>::~ATNNode((ATNNode<char> *)local_d0);
  }
  wVar2 = Stream::skip_whitespace(stream);
  if (wVar2 == L'*') {
    sVar5 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    add_node(this,(int)sVar5 + -1,0);
    pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::back
                       (&this->m_nodes);
    ATNNode<char>::add_transition(pvVar6,(int)sVar4,0);
    sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    add_node(this,(int)sVar4 + -1,0);
    pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
             operator[](&this->m_nodes,(long)iVar1);
    sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    ATNNode<char>::add_transition(pvVar6,(int)sVar4 + -1,0);
    Stream::discard(stream);
  }
  else if (wVar2 == L'+') {
    sVar5 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    add_node(this,(int)sVar5 + -1,0);
    pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::back
                       (&this->m_nodes);
    ATNNode<char>::add_transition(pvVar6,(int)sVar4,0);
    Stream::discard(stream);
  }
  else if (wVar2 == L'?') {
    sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    add_node(this,(int)sVar4 + -1,0);
    pvVar6 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::
             operator[](&this->m_nodes,(long)iVar1);
    sVar4 = std::vector<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>::size
                      (&this->m_nodes);
    ATNNode<char>::add_transition(pvVar6,(int)sVar4 + -1,0);
    Stream::discard(stream);
  }
  return;
}

Assistant:

void ATNMachine<TCHAR>::parse_atom(Stream& stream)
{
	int origin_state = m_nodes.size() - 1;
	wchar_t ch = stream.skip_whitespace();

	int anchor_state = m_nodes.size();

	if (ch == L'(')
	{
		stream.discard();
		parse_selection(stream);

		ch = stream.skip_whitespace();
		if (ch != L')')
			throw stream.unexpected(ch);
		stream.discard();
	}
	else
	{
        ATNNode<TCHAR> node(stream);

        if (m_globalid > 0 && (node.type() == ATNNodeType::LiteralTerminal || node.type() == ATNNodeType::RegularTerminal))
        {
            m_nodes.back().add_transition(m_nodes.size());
            m_nodes.emplace_back(ATNNodeType::WhiteSpace);
        }

		m_nodes.back().add_transition(m_nodes.size());
		m_nodes.push_back(node);
	}

	ch = stream.skip_whitespace();
	switch (ch)
	{
	case L'*':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	case L'+':
		add_node(m_nodes.size() - 1);
		m_nodes.back().add_transition(anchor_state);
		stream.discard();
		break;
	case L'?':
		add_node(m_nodes.size() - 1);
		m_nodes[origin_state].add_transition(m_nodes.size() - 1);
		stream.discard();
		break;
	}
}